

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode
JsSetRuntimeBeforeCollectCallback
          (JsRuntimeHandle runtime,void *callbackState,JsBeforeCollectCallback beforeCollectCallback
          )

{
  JsErrorCode JVar1;
  JsrtRuntime *runtime_1;
  AutoNestedHandledExceptionType local_48 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtime == (JsRuntimeHandle)0x0) {
    JVar1 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtime);
    JVar1 = JsNoError;
    JsrtRuntime::SetBeforeCollectCallback
              ((JsrtRuntime *)runtime,beforeCollectCallback,callbackState);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetRuntimeBeforeCollectCallback(_In_ JsRuntimeHandle runtime, _In_opt_ void *callbackState, _In_ JsBeforeCollectCallback beforeCollectCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtime);

        JsrtRuntime::FromHandle(runtime)->SetBeforeCollectCallback(beforeCollectCallback, callbackState);
        return JsNoError;
    });
}